

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signed-interest.c
# Opt level: O2

int ndn_signed_interest_ecdsa_verify(ndn_interest_t *interest,ndn_ecc_pub_t *pub_key)

{
  uint uVar1;
  uint uVar2;
  uint32_t input_size;
  int iVar3;
  byte bVar4;
  ulong uVar5;
  uint8_t local_2e8 [680];
  undefined1 local_40 [8];
  ndn_encoder_t temp_encoder;
  
  iVar3 = -0x11;
  if (-1 < (char)interest->flags) {
    return iVar3;
  }
  if ((interest->name).components[(ulong)(interest->name).components_size - 1].type == 2) {
    bVar4 = 0;
    memset(local_2e8,0,0x2a8);
    temp_encoder.output_value = (uint8_t *)0x2a8;
    local_40 = (undefined1  [8])local_2e8;
    do {
      if ((int)((interest->name).components_size - 1) <= (int)(uint)bVar4) {
        uVar2 = temp_encoder.output_value._4_4_;
        uVar5 = (ulong)temp_encoder.output_value._4_4_;
        if ((interest->flags & 0x40) != 0) {
          iVar3 = encoder_append_var((ndn_encoder_t *)local_40,0x24);
          if (iVar3 != 0) {
            return iVar3;
          }
          iVar3 = encoder_append_var((ndn_encoder_t *)local_40,(interest->parameters).size);
          if (iVar3 != 0) {
            return iVar3;
          }
          uVar1 = (interest->parameters).size;
          if ((int)((int)temp_encoder.output_value - temp_encoder.output_value._4_4_) < (int)uVar1)
          {
            return -10;
          }
          memcpy((uint8_t *)((long)local_40 + (ulong)temp_encoder.output_value._4_4_),
                 &interest->parameters,(ulong)uVar1);
          temp_encoder.output_value =
               (uint8_t *)
               CONCAT44(temp_encoder.output_value._4_4_ + uVar1,(int)temp_encoder.output_value);
        }
        iVar3 = ndn_signature_info_tlv_encode((ndn_encoder_t *)local_40,&interest->signature);
        if (iVar3 != 0) {
          return iVar3;
        }
        input_size = temp_encoder.output_value._4_4_;
        iVar3 = ndn_signature_value_tlv_encode((ndn_encoder_t *)local_40,&interest->signature);
        if (iVar3 != 0) {
          return iVar3;
        }
        iVar3 = ndn_ecdsa_verify((uint8_t *)local_40,input_size,(interest->signature).sig_value,
                                 (interest->signature).sig_size,pub_key);
        if (iVar3 < 0) {
          return iVar3;
        }
        bVar4 = (interest->name).components_size;
        iVar3 = ndn_sha256_verify((uint8_t *)((long)local_40 + uVar5),
                                  temp_encoder.output_value._4_4_ - uVar2,
                                  (interest->name).components[(ulong)bVar4 - 1].value,
                                  (uint)(interest->name).components[(ulong)bVar4 - 1].size);
        return iVar3 >> 0x1f & 0xffffffe2;
      }
      iVar3 = name_component_tlv_encode
                        ((ndn_encoder_t *)local_40,(interest->name).components + bVar4);
      bVar4 = bVar4 + 1;
    } while (iVar3 == 0);
  }
  return iVar3;
}

Assistant:

int
ndn_signed_interest_ecdsa_verify(const ndn_interest_t* interest, const ndn_ecc_pub_t* pub_key)
{
  // check the signed Interest format
  if (!ndn_interest_is_signed(interest) ||
      interest->name.components[interest->name.components_size - 1].type != TLV_ParametersSha256DigestComponent) {
    return NDN_UNSUPPORTED_FORMAT;
  }
  int ret_val = -1;
  uint8_t be_signed[NDN_SIGNED_INTEREST_BE_SIGNED_MAX_SIZE] = {0};
  ndn_encoder_t temp_encoder;
  encoder_init(&temp_encoder, be_signed, NDN_SIGNED_INTEREST_BE_SIGNED_MAX_SIZE);

  // the signing input starts at Name's Value (V) excluding the ending component
  for (uint8_t i = 0; i < interest->name.components_size - 1; i++) {
    ret_val = name_component_tlv_encode(&temp_encoder, &interest->name.components[i]);
    if (ret_val != NDN_SUCCESS) return ret_val;
  }
  // the digest input starts at parameters
  uint32_t param_block_starting = temp_encoder.offset;
  if (ndn_interest_has_Parameters(interest)) {
    ret_val = encoder_append_type(&temp_encoder, TLV_ApplicationParameters);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_length(&temp_encoder, interest->parameters.size);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_raw_buffer_value(&temp_encoder, interest->parameters.value, interest->parameters.size);
    if (ret_val != NDN_SUCCESS) return ret_val;
  }
  ret_val = ndn_signature_info_tlv_encode(&temp_encoder, &interest->signature);
  if (ret_val != NDN_SUCCESS) return ret_val;
  // the signing input ends at signature info
  uint32_t siginfo_block_ending = temp_encoder.offset;
  ret_val = ndn_signature_value_tlv_encode(&temp_encoder, &interest->signature);
  if (ret_val != NDN_SUCCESS) return ret_val;

  int result = ndn_ecdsa_verify(temp_encoder.output_value, siginfo_block_ending,
                                interest->signature.sig_value, interest->signature.sig_size,
                                pub_key);
  if (result < 0) return result;

  result = ndn_sha256_verify(&temp_encoder.output_value[param_block_starting],
                             temp_encoder.offset - param_block_starting,
                             interest->name.components[interest->name.components_size - 1].value,
                             interest->name.components[interest->name.components_size - 1].size);
  if (result < 0)
    return NDN_SEC_SIGNED_INTEREST_INVALID_DIGEST;
  return NDN_SUCCESS;
}